

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

uint __thiscall
ON_SubDComponentList::CreateFromVertexIdList
          (ON_SubDComponentList *this,ON_SubD *subd,ON_SimpleArray<unsigned_int> *vertex_id_list)

{
  bool bVar1;
  uint uVar2;
  ON_SubDVertex *pOVar3;
  uint marked_component_count;
  ON_ComponentStatus *this_00;
  uint i;
  ulong uVar4;
  ON_SubDComponentMarksClearAndRestore saved_marks;
  
  ON_SubDComponentMarksClearAndRestore::ON_SubDComponentMarksClearAndRestore(&saved_marks,subd);
  uVar2 = vertex_id_list->m_count;
  marked_component_count = 0;
  for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    if (1 < vertex_id_list->m_a[uVar4] + 1) {
      pOVar3 = ON_SubD::VertexFromId(subd,vertex_id_list->m_a[uVar4]);
      if (pOVar3 != (ON_SubDVertex *)0x0) {
        this_00 = &(pOVar3->super_ON_SubDComponentBase).m_status;
        bVar1 = ON_ComponentStatus::RuntimeMark(this_00);
        if (!bVar1) {
          ON_ComponentStatus::SetRuntimeMark(this_00);
          marked_component_count = marked_component_count + 1;
        }
      }
    }
  }
  uVar2 = Internal_Create(this,subd,true,false,false,true,marked_component_count);
  ON_SubDComponentMarksClearAndRestore::~ON_SubDComponentMarksClearAndRestore(&saved_marks);
  return uVar2;
}

Assistant:

unsigned ON_SubDComponentList::CreateFromVertexIdList(const ON_SubD& subd, const ON_SimpleArray<unsigned>& vertex_id_list)
{
  ON_SubDComponentMarksClearAndRestore saved_marks(subd);
  const unsigned count = vertex_id_list.UnsignedCount();
  unsigned marked_count = 0;
  for (unsigned i = 0; i < count; ++i)
  {
    const unsigned vertex_id = vertex_id_list[i];
    if (vertex_id <= 0 || vertex_id >= ON_UNSET_UINT_INDEX)
      continue;
    const ON_SubDVertex* v = subd.VertexFromId(vertex_id);
    if (nullptr == v)
      continue;
    if (v->m_status.RuntimeMark())
      continue;
    v->m_status.SetRuntimeMark();
    ++marked_count;
  }
  return Internal_Create(subd, true, false, false, true, marked_count);
}